

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  pointer pcVar1;
  pointer ppcVar2;
  bool bVar3;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  string *inName;
  pointer ppcVar4;
  pointer this_00;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_70;
  string linkName4;
  
  pcVar1 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1)
  {
    std::__cxx11::string::string((string *)&linkName3,(string *)linkName);
    std::__cxx11::string::append((char *)&linkName3);
    cmSourceGroup::GetFullName_abi_cxx11_(this_00);
    std::__cxx11::string::append((string *)&linkName3);
    linkName4._M_dataplus._M_p._0_1_ = 0x5c;
    local_70._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )linkName3._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(linkName3._M_dataplus._M_p + linkName3._M_string_length),(char *)&linkName4,
               (char *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkName4,"virtual:/virtual",(allocator<char> *)&local_70);
    AppendLinkedResource(xml,&linkName3,&linkName4,VirtualFolder);
    std::__cxx11::string::~string((string *)&linkName4);
    sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
    if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_start !=
        (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      WriteGroups(this,sourceGroups_00,linkName,xml);
    }
    __x = cmSourceGroup::GetSourceFiles(this_00);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(&sFiles,__x);
    ppcVar2 = sFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar4 = sFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar2;
        ppcVar4 = ppcVar4 + 1) {
      inName = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar4);
      bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&linkName4,(string *)&linkName3);
        std::__cxx11::string::append((char *)&linkName4);
        cmsys::SystemTools::GetFilenameName(&local_70,inName);
        std::__cxx11::string::append((string *)&linkName4);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string((string *)&local_70,(string *)inName);
        AppendLinkedResource(xml,&linkName4,&local_70,LinkToFile);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&linkName4);
      }
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&sFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    std::__cxx11::string::~string((string *)&linkName3);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = linkName;
    linkName3 += "/";
    linkName3 += sg.GetFullName();

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 = linkName3;
        linkName4 += "/";
        linkName4 += cmSystemTools::GetFilenameName(fullPath);
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}